

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeInteger.c
# Opt level: O0

asn_enc_rval_t *
NativeInteger_encode_xer
          (asn_TYPE_descriptor_t *td,void *sptr,int ilevel,xer_encoder_flags_e flags,
          asn_app_consume_bytes_f *cb,void *app_key)

{
  int iVar1;
  ulong uVar2;
  undefined8 *in_RDX;
  char *__format;
  asn_TYPE_descriptor_s *in_RSI;
  asn_enc_rval_t *in_RDI;
  code *in_R9;
  bool bVar3;
  undefined8 in_stack_00000008;
  asn_enc_rval_t *tmp_error;
  long *native;
  asn_enc_rval_t er;
  char scratch [32];
  asn_INTEGER_specifics_t *specs;
  char *local_98;
  char *local_80;
  char local_48 [32];
  void *local_28;
  code *local_20;
  undefined8 *local_10;
  asn_TYPE_descriptor_s *local_8;
  
  local_28 = in_RSI->specifics;
  if (in_RDX == (undefined8 *)0x0) {
    in_RDI->encoded = -1;
    in_RDI->failed_type = in_RSI;
    in_RDI->structure_ptr = (void *)0x0;
    if (in_RSI == (asn_TYPE_descriptor_s *)0x0) {
      local_80 = "";
    }
    else {
      local_80 = in_RSI->name;
    }
    ASN_DEBUG("Failed to encode element %s",local_80);
  }
  else {
    bVar3 = false;
    if (local_28 != (void *)0x0) {
      bVar3 = *(int *)((long)local_28 + 0x20) != 0;
    }
    __format = "%ld";
    if (bVar3) {
      __format = "%lu";
    }
    local_20 = in_R9;
    local_10 = in_RDX;
    local_8 = in_RSI;
    iVar1 = snprintf(local_48,0x20,__format,*in_RDX);
    uVar2 = (ulong)iVar1;
    if (((0 < (long)uVar2) && (uVar2 < 0x20)) &&
       (iVar1 = (*local_20)(local_48,uVar2,in_stack_00000008), -1 < iVar1)) {
      in_RDI->encoded = uVar2;
      in_RDI->failed_type = (asn_TYPE_descriptor_s *)0x0;
      in_RDI->structure_ptr = (void *)0x0;
      return in_RDI;
    }
    in_RDI->encoded = -1;
    in_RDI->failed_type = local_8;
    in_RDI->structure_ptr = local_10;
    if (local_8 == (asn_TYPE_descriptor_s *)0x0) {
      local_98 = "";
    }
    else {
      local_98 = local_8->name;
    }
    ASN_DEBUG("Failed to encode element %s",local_98);
  }
  return in_RDI;
}

Assistant:

asn_enc_rval_t
NativeInteger_encode_xer(asn_TYPE_descriptor_t *td, void *sptr,
	int ilevel, enum xer_encoder_flags_e flags,
		asn_app_consume_bytes_f *cb, void *app_key) {
	asn_INTEGER_specifics_t *specs=(asn_INTEGER_specifics_t *)td->specifics;
	char scratch[32];	/* Enough for 64-bit int */
	asn_enc_rval_t er;
	const long *native = (const long *)sptr;

	(void)ilevel;
	(void)flags;

	if(!native) ASN__ENCODE_FAILED;

	er.encoded = snprintf(scratch, sizeof(scratch),
			(specs && specs->field_unsigned)
			? "%lu" : "%ld", *native);
	if(er.encoded <= 0 || (size_t)er.encoded >= sizeof(scratch)
		|| cb(scratch, er.encoded, app_key) < 0)
		ASN__ENCODE_FAILED;

	ASN__ENCODED_OK(er);
}